

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall
Json::OurReader::decodeUnicodeEscapeSequence
          (OurReader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  string local_60;
  uint *local_40;
  OurReader *local_38;
  
  if ((long)end - (long)*current < 4) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Bad unicode escape sequence in string: four digits expected.",""
              );
    addError(this,&local_60,token,*current);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    bVar7 = false;
  }
  else {
    bVar7 = false;
    uVar6 = 0;
    uVar5 = 0;
    local_40 = ret_unicode;
    local_38 = this;
    do {
      pcVar2 = *current;
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar4 = (int)cVar1;
      uVar5 = uVar5 * 0x10;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar5 = (uVar5 + iVar4) - 0x30;
LAB_0011100a:
        bVar3 = true;
      }
      else {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar5 = (uVar5 + iVar4) - 0x57;
          goto LAB_0011100a;
        }
        if ((byte)(cVar1 + 0xbfU) < 6) {
          uVar5 = (uVar5 + iVar4) - 0x37;
          goto LAB_0011100a;
        }
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "Bad unicode escape sequence in string: hexadecimal digit expected.","");
        addError(this,&local_60,token,*current);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        bVar3 = false;
        this = local_38;
      }
      if (!bVar3) break;
      bVar7 = 2 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
    if (bVar7) {
      *local_40 = uVar5;
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool OurReader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}